

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

double __thiscall llvm::detail::DoubleAPFloat::remainder(DoubleAPFloat *this,double __x,double __y)

{
  double __x_00;
  double extraout_XMM0_Qa;
  APFloat Tmp;
  undefined1 local_80 [32];
  DoubleAPFloat local_60;
  APFloat local_50;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt((DoubleAPFloat *)local_80);
    IEEEFloat::IEEEFloat
              (&local_50.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)local_80);
    APInt::~APInt((APInt *)local_80);
    bitcastToAPInt(&local_60);
    IEEEFloat::IEEEFloat
              ((IEEEFloat *)(local_80 + 8),(fltSemantics *)semPPCDoubleDoubleLegacy,
               (APInt *)&local_60);
    APFloat::remainder(&local_50,__x_00,__y);
    APFloat::Storage::~Storage((Storage *)(local_80 + 8));
    APInt::~APInt((APInt *)&local_60);
    APFloat::bitcastToAPInt((APFloat *)&local_60);
    DoubleAPFloat((DoubleAPFloat *)local_80,(fltSemantics *)semPPCDoubleDouble,(APInt *)&local_60);
    operator=(this,(DoubleAPFloat *)local_80);
    std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::~unique_ptr
              ((unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_> *)(local_80 + 8))
    ;
    APInt::~APInt((APInt *)&local_60);
    APFloat::Storage::~Storage((Storage *)&local_50.U.IEEE);
    return extraout_XMM0_Qa;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1034,
                "APFloat::opStatus llvm::detail::DoubleAPFloat::remainder(const DoubleAPFloat &)");
}

Assistant:

APFloat::opStatus DoubleAPFloat::remainder(const DoubleAPFloat &RHS) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret =
      Tmp.remainder(APFloat(semPPCDoubleDoubleLegacy, RHS.bitcastToAPInt()));
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}